

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

void decodeTriple(char *result,int *difx,int *dify)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int x;
  int m;
  int c1;
  int *dify_local;
  int *difx_local;
  char *result_local;
  
  cVar1 = decodeChar(*result);
  iVar2 = (int)cVar1;
  if (iVar2 < 0x18) {
    iVar3 = decodeBase31(result + 1);
    *difx = (iVar2 % 6) * 0x1c + iVar3 / 0x22;
    *dify = (iVar2 / 6) * 0x22 + iVar3 % 0x22;
  }
  else {
    iVar3 = decodeBase31(result + 1);
    *dify = iVar3 % 0x28 + 0x88;
    *difx = iVar3 / 0x28 + (iVar2 + -0x18) * 0x18;
  }
  return;
}

Assistant:

static void decodeTriple(const char *result, int *difx, int *dify) {
    // decode the first character
    const int c1 = decodeChar(*result++);
    ASSERT(result);
    ASSERT(difx);
    ASSERT(dify);
    if (c1 < 24) {
        int m = decodeBase31(result);
        *difx = (c1 % 6) * 28 + (m / 34);
        *dify = (c1 / 6) * 34 + (m % 34);
    } else // bottom row
    {
        int x = decodeBase31(result);
        *dify = (x % 40) + 136;
        *difx = (x / 40) + 24 * (c1 - 24);
    }
}